

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O2

void Dch_CollectSuper_rec(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = fFirst == 0;
  while (((((ulong)pObj & 1) == 0 && (((uint)*(ulong *)&pObj->field_0x18 & 7) != 2)) &&
         (!(bool)(bVar2 & (*(ulong *)&pObj->field_0x18 & 0xffffff80) != 0)))) {
    if (fUseMuxes != 0) {
      iVar1 = Aig_ObjIsMuxType(pObj);
      if (iVar1 != 0) break;
    }
    Dch_CollectSuper_rec(pObj->pFanin0,vSuper,0,fUseMuxes);
    pObj = pObj->pFanin1;
    bVar2 = true;
  }
  Vec_PtrPushUnique(vSuper,pObj);
  return;
}

Assistant:

void Dch_CollectSuper_rec( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || 
         (!fFirst && Aig_ObjRefs(pObj) > 1) || 
         (fUseMuxes && Aig_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Dch_CollectSuper_rec( Aig_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Dch_CollectSuper_rec( Aig_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}